

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_list.hpp
# Opt level: O3

bool __thiscall
libtorrent::aux::torrent_list<libtorrent::aux::torrent>::insert
          (torrent_list<libtorrent::aux::torrent> *this,info_hash_t *ih,
          shared_ptr<libtorrent::aux::torrent> *t)

{
  anon_class_24_3_1a2a6543 f;
  bool bVar1;
  anon_class_16_2_ad0be178 f_00;
  bool duplicate;
  array<bool,_4> rollback;
  bool local_5d;
  array<bool,_4> local_5c;
  torrent_list<libtorrent::aux::torrent> *local_58;
  shared_ptr<libtorrent::aux::torrent> *psStack_50;
  array<bool,_4> *local_48;
  scope_end_impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_aux__torrent_list_hpp:83:35)>
  local_40;
  
  local_5d = false;
  f_00.duplicate = &local_5d;
  f_00.this = this;
  info_hash_t::
  for_each<libtorrent::aux::torrent_list<libtorrent::aux::torrent>::insert(libtorrent::info_hash_t_const&,std::shared_ptr<libtorrent::aux::torrent>)::_lambda(libtorrent::digest32<160l>const&,libtorrent::protocol_version)_1_>
            (ih,f_00);
  bVar1 = local_5d;
  if (local_5d == false) {
    local_48 = &local_5c;
    local_5c.super_array<bool,_4UL>._M_elems = (array<bool,_4UL>)(_Type)0x0;
    local_40.m_armed = true;
    f.t = t;
    f.this = this;
    f.rollback = local_48;
    local_58 = this;
    psStack_50 = t;
    local_40.m_fun.ih = ih;
    local_40.m_fun.rollback = local_48;
    local_40.m_fun.this = this;
    info_hash_t::
    for_each<libtorrent::aux::torrent_list<libtorrent::aux::torrent>::insert(libtorrent::info_hash_t_const&,std::shared_ptr<libtorrent::aux::torrent>)::_lambda(libtorrent::digest32<160l>const&,libtorrent::protocol_version)_2_>
              (ih,f);
    ::std::
    vector<std::shared_ptr<libtorrent::aux::torrent>,std::allocator<std::shared_ptr<libtorrent::aux::torrent>>>
    ::emplace_back<std::shared_ptr<libtorrent::aux::torrent>>
              ((vector<std::shared_ptr<libtorrent::aux::torrent>,std::allocator<std::shared_ptr<libtorrent::aux::torrent>>>
                *)this,t);
    local_40.m_armed = false;
    scope_end_impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/aux_/torrent_list.hpp:83:35)>
    ::~scope_end_impl(&local_40);
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool insert(info_hash_t const& ih, std::shared_ptr<T> t)
	{
		INVARIANT_CHECK;
		TORRENT_ASSERT(t);

		bool duplicate = false;
		ih.for_each([&](sha1_hash const& hash, protocol_version)
		{
			if (m_index.find(hash) != m_index.end()) duplicate = true;
		});

		// if we already have a torrent with this hash, don't do anything
		if (duplicate) return false;

		aux::array<bool, 4> rollback({ false, false, false, false});
		auto abort_add = aux::scope_end([&]
		{
			ih.for_each([&](sha1_hash const& hash, protocol_version const v)
			{
				if (rollback[int(v)])
					m_index.erase(hash);

#if !defined TORRENT_DISABLE_ENCRYPTION
				if (rollback[2 + int(v)])
				{
					static char const req2[4] = { 'r', 'e', 'q', '2' };
					hasher h(req2);
					h.update(hash);
						m_obfuscated_index.erase(h.final());
				}
#endif
			});
		});

		ih.for_each([&](sha1_hash const& hash, protocol_version const v)
		{
			if (m_index.insert({hash, t.get()}).second)
				rollback[int(v)] = true;

#if !defined TORRENT_DISABLE_ENCRYPTION
			static char const req2[4] = { 'r', 'e', 'q', '2' };
			hasher h(req2);
			h.update(hash);
			// this is SHA1("req2" + info-hash), used for
			// encrypted hand shakes
			if (m_obfuscated_index.insert({h.final(), t.get()}).second)
				rollback[2 + int(v)] = true;
#endif
		});

		m_array.emplace_back(std::move(t));

		abort_add.disarm();

		return true;
	}